

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O1

unsigned_long mxx::exscan<unsigned_long,std::plus<unsigned_long>>(undefined8 x,long param_2)

{
  unsigned_long uVar1;
  unsigned_long result;
  custom_op<unsigned_long,_true> op;
  unsigned_long local_60;
  custom_op<unsigned_long,_true> local_58;
  
  custom_op<unsigned_long,true>::custom_op<std::plus<unsigned_long>>
            ((custom_op<unsigned_long,true> *)&local_58);
  MPI_Exscan(x,&local_60,1,local_58.m_type_copy,local_58.m_op,*(undefined8 *)(param_2 + 8));
  if (*(int *)(param_2 + 0x14) == 0) {
    local_60 = 0;
  }
  uVar1 = local_60;
  custom_op<unsigned_long,_true>::~custom_op(&local_58);
  return uVar1;
}

Assistant:

T exscan(const T& x, Func func, const mxx::comm& comm = mxx::comm()) {
    // get op
    mxx::custom_op<T> op(std::forward<Func>(func));
    // perform reduction
    T result;
    MPI_Exscan(const_cast<T*>(&x), &result, 1, op.get_type(), op.get_op(), comm);
    if (comm.rank() == 0)
      result = T();
    return result;
}